

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeSetJacTimesRhsFnB(void *cvode_mem,int which,CVRhsFn jtimesRhsFn)

{
  CVLsMemB *in_RDX;
  int retval;
  void *cvodeB_mem;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = cvLs_AccessLMemB(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                             in_stack_ffffffffffffffb8,
                             (CVodeMem *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (CVadjMem *)&stack0xffffffffffffffc0,(CVodeBMem *)0x13f47f,in_RDX);
  if (local_4 == 0) {
    local_4 = CVodeSetJacTimesRhsFn
                        (in_stack_ffffffffffffffc8,
                         (CVRhsFn)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return local_4;
}

Assistant:

int CVodeSetJacTimesRhsFnB(void* cvode_mem, int which, CVRhsFn jtimesRhsFn)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  void* cvodeB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Call the corresponding "set" routine for the backward problem */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  return (CVodeSetJacTimesRhsFn(cvodeB_mem, jtimesRhsFn));
}